

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O0

void __thiscall NaDynAr<char_*>::print_contents(NaDynAr<char_*> *this)

{
  long in_RDI;
  item *p;
  int i;
  long local_18;
  
  NaPrintLog("DynAr(this=0x%08p), %d items, contents:\n",in_RDI,(ulong)*(uint *)(in_RDI + 8));
  if (*(long *)(in_RDI + 0x10) != 0) {
    local_18 = *(long *)(in_RDI + 0x10);
    do {
      NaPrintLog("  [%d]\t");
      item::print_self((item *)0x1602bc);
      local_18 = *(long *)(local_18 + 8);
    } while (local_18 != 0);
  }
  return;
}

Assistant:

virtual void  print_contents () const {
    int	i = 0;
    NaPrintLog("DynAr(this=0x%08p), %d items, contents:\n", this, nItems);
    if(NULL != pHead){
      item	*p = pHead;

      do{
	NaPrintLog("  [%d]\t", i++);
	p->print_self();
	p = p->pNext;
      }while(NULL != p);
    }
  }